

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

bool __thiscall DConversationMenu::MenuEvent(DConversationMenu *this,int mkey,bool fromcontroller)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  BYTE it;
  
  if (demoplayback) {
    if (mkey != 7) {
      return false;
    }
  }
  else {
    bVar2 = false;
    switch(mkey) {
    case 0:
      if (0 < mSelection) {
        mSelection = mSelection + -1;
        return true;
      }
      mSelection = (this->mResponses).Count - 1;
      return true;
    case 1:
      iVar3 = mSelection + 1;
      mSelection = 0;
      if (iVar3 < (int)(this->mResponses).Count) {
        mSelection = iVar3;
      }
      goto LAB_005197ba;
    default:
      goto switchD_0051971b_caseD_2;
    case 6:
      it = '<';
      if ((uint)mSelection < (this->mResponses).Count) {
        uVar1 = this->mCurNode->ThisNodeNum;
        if (StrifeDialogues.Count <= uVar1) {
          __assert_fail("(unsigned)mCurNode->ThisNodeNum < StrifeDialogues.Size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_conversation.cpp"
                        ,0x33c,"virtual bool DConversationMenu::MenuEvent(int, bool)");
        }
        if (StrifeDialogues.Array[(int)uVar1] != this->mCurNode) {
          __assert_fail("StrifeDialogues[mCurNode->ThisNodeNum] == mCurNode",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_conversation.cpp"
                        ,0x33d,"virtual bool DConversationMenu::MenuEvent(int, bool)");
        }
        Net_WriteByte(';');
        Net_WriteWord((short)this->mCurNode->ThisNodeNum);
        it = (BYTE)mSelection;
      }
      break;
    case 7:
      it = '=';
    }
    Net_WriteByte(it);
  }
  (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
LAB_005197ba:
  bVar2 = true;
switchD_0051971b_caseD_2:
  return bVar2;
}

Assistant:

bool MenuEvent(int mkey, bool fromcontroller)
	{
		if (demoplayback)
		{ // During demo playback, don't let the user do anything besides close this menu.
			if (mkey == MKEY_Back)
			{
				Close();
				return true;
			}
			return false;
		}
		if (mkey == MKEY_Up)
		{
			if (--mSelection < 0) mSelection = mResponses.Size() - 1;
			return true;
		}
		else if (mkey == MKEY_Down)
		{
			if (++mSelection >= (int)mResponses.Size()) mSelection = 0;
			return true;
		}
		else if (mkey == MKEY_Back)
		{
			Net_WriteByte (DEM_CONVNULL);
			Close();
			return true;
		}
		else if (mkey == MKEY_Enter)
		{
			if ((unsigned)mSelection >= mResponses.Size())
			{
				Net_WriteByte(DEM_CONVCLOSE);
			}
			else
			{
				// Send dialogue and reply numbers across the wire.
				assert((unsigned)mCurNode->ThisNodeNum < StrifeDialogues.Size());
				assert(StrifeDialogues[mCurNode->ThisNodeNum] == mCurNode);
				Net_WriteByte(DEM_CONVREPLY);
				Net_WriteWord(mCurNode->ThisNodeNum);
				Net_WriteByte(mSelection);
			}
			Close();
			return true;
		}
		return false;
	}